

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_SmallOptimization_Test::TestBody
          (RepeatedPtrFieldTest_SmallOptimization_Test *this)

{
  ThreadSafeArena *this_00;
  int iVar1;
  RepeatedPtrFieldBase *this_01;
  Rep *pRVar2;
  RepeatedPtrFieldBase *pRVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  bool bVar5;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string str2;
  string str;
  uint64_t usage_before;
  Arena arena;
  AssertHelper local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  AssertHelper local_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [16];
  AssertHelper local_d8;
  undefined1 local_d0 [176];
  
  this_00 = (ThreadSafeArena *)(local_d0 + 8);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(this_00);
  this_01 = (RepeatedPtrFieldBase *)Arena::Allocate((Arena *)this_00,0x18);
  this_01->tagged_rep_or_elem_ = (void *)0x0;
  this_01->current_size_ = 0;
  this_01->capacity_proxy_ = 0;
  this_01->arena_ = (Arena *)this_00;
  local_118._0_4_ = this_01->capacity_proxy_ + 1;
  local_138._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"array->Capacity()","1",(int *)local_118,(int *)local_138);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x33d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_118 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_118 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  iVar1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SpaceUsedExcludingSelf
                    ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_01);
  local_118._0_4_ = iVar1;
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"array->SpaceUsedExcludingSelf()","0",(int *)local_118,
             (int *)local_138);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x33e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_118 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_118 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8[0] = 0;
  local_f8 = (undefined1  [8])local_e8;
  local_d0._0_8_ = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)(local_d0 + 8))
  ;
  protobuf::internal::RepeatedPtrFieldBase::
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (this_01,(Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)local_f8
            );
  local_150.data_._0_4_ =
       RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::SpaceUsedExcludingSelf
                 ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01);
  local_138 = (undefined1  [8])&DAT_00000020;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_118,"array->SpaceUsedExcludingSelf()","sizeof(str)",(int *)&local_150
             ,(unsigned_long *)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x346,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_138 = (undefined1  [8])
              protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)(local_d0 + 8));
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_118,"usage_before","arena.SpaceUsed()",(unsigned_long *)local_d0,
             (unsigned_long *)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x348,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pRVar3 = this_01;
  if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  local_138 = (undefined1  [8])pRVar3->tagged_rep_or_elem_;
  local_150.data_ = (AssertHelperData *)local_f8;
  testing::internal::CmpHelperEQ<std::__cxx11::string*,std::__cxx11::string*>
            ((internal *)local_118,"&*array->begin()","&str",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_150);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x34a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pRVar3 = this_01;
  if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  local_138 = (undefined1  [8])local_f8;
  testing::internal::CmpHelperEQ<std::__cxx11::string*,std::__cxx11::string*>
            ((internal *)local_118,"array->pointer_begin()[0]","&str",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pRVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x34b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_138 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_138 + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  pRVar3 = this_01;
  if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  if (pRVar3 < this_01) {
    bVar5 = false;
  }
  else {
    pRVar3 = this_01;
    if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
      pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
      pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
    }
    bVar5 = pRVar3 < this_01 + 1;
  }
  local_138[0] = (internal)bVar5;
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_138,(AssertionResult *)0x1369fb0,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x351,(char *)local_118);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,
                      CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1)
      ;
    }
    if (local_150.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150.data_ + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108._M_local_buf[0] = '\0';
  local_118 = (undefined1  [8])&local_108;
  protobuf::internal::RepeatedPtrFieldBase::
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (this_01,(Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)
                     local_118);
  local_150.data_._0_4_ = this_01->capacity_proxy_ + 1;
  local_140.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_138,"array->Capacity()","3",(int *)&local_150,(int *)&local_140);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x356,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_150.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150.data_ + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_140.data_._0_4_ =
       RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::SpaceUsedExcludingSelf
                 ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01);
  local_150.data_ = (AssertHelperData *)((long)this_01->capacity_proxy_ * 8 + 0x50);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_138,"array->SpaceUsedExcludingSelf()",
             "(1 + array->Capacity()) * sizeof(void*) + 2 * sizeof(str)",(int *)&local_140,
             (unsigned_long *)&local_150);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x359,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_150.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150.data_ + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  local_150.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)(local_d0 + 8));
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)local_138,"usage_before","arena.SpaceUsed()",(unsigned_long *)local_d0,
             (unsigned_long *)&local_150);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x35b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_150.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_150.data_ + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  pRVar3 = this_01;
  if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  bVar5 = true;
  if (this_01 <= pRVar3) {
    pRVar3 = this_01;
    if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
      pRVar2 = protobuf::internal::RepeatedPtrFieldBase::rep(this_01);
      pRVar3 = (RepeatedPtrFieldBase *)pRVar2->elements;
    }
    bVar5 = this_01 + 1 <= pRVar3;
  }
  local_150.data_._0_1_ = bVar5;
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_150,(AssertionResult *)0x1369fb0,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x35d,(char *)local_138);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_138 != (undefined1  [8])&local_128) {
      operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_140.data_._4_4_,(int)local_140.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_140.data_._4_4_,(int)local_140.data_) + 8))();
    }
  }
  if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,local_148);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if (local_f8 != (undefined1  [8])local_e8) {
    operator_delete((void *)local_f8,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)(local_d0 + 8));
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, SmallOptimization) {
  // Properties checked here are not part of the contract of RepeatedPtrField,
  // but we test them to verify that SSO is working as expected by the
  // implementation.

  // We use an arena to easily measure memory usage, but not needed.
  Arena arena;
  auto* array = Arena::Create<RepeatedPtrField<std::string>>(&arena);
  EXPECT_EQ(array->Capacity(), 1);
  EXPECT_EQ(array->SpaceUsedExcludingSelf(), 0);
  std::string str;
  auto usage_before = arena.SpaceUsed();
  // We use UnsafeArenaAddAllocated just to grow the array without creating
  // objects or causing extra cleanup costs in the arena to make the
  // measurements simpler.
  array->UnsafeArenaAddAllocated(&str);
  // No backing array, just the string.
  EXPECT_EQ(array->SpaceUsedExcludingSelf(), sizeof(str));
  // We have not used any arena space.
  EXPECT_EQ(usage_before, arena.SpaceUsed());
  // Verify the string is where we think it is.
  EXPECT_EQ(&*array->begin(), &str);
  EXPECT_EQ(array->pointer_begin()[0], &str);
  auto is_inlined = [array]() {
    return std::less_equal<void*>{}(array, &*array->pointer_begin()) &&
           std::less<void*>{}(&*array->pointer_begin(), array + 1);
  };
  // The T** in pointer_begin points into the sso in the object.
  EXPECT_TRUE(is_inlined());

  // Adding a second object stops sso.
  std::string str2;
  array->UnsafeArenaAddAllocated(&str2);
  EXPECT_EQ(array->Capacity(), 3);
  // Backing array and the strings.
  EXPECT_EQ(array->SpaceUsedExcludingSelf(),
            (1 + array->Capacity()) * sizeof(void*) + 2 * sizeof(str));
  // We used some arena space now.
  EXPECT_LT(usage_before, arena.SpaceUsed());
  // And the pointer_begin is not in the sso anymore.
  EXPECT_FALSE(is_inlined());
}